

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderGrid.cpp
# Opt level: O2

void __thiscall OrderGrid::paintEvent(OrderGrid *this,QPaintEvent *evt)

{
  CellPainter *this_00;
  int x;
  byte bVar1;
  bool bVar2;
  int w;
  int h;
  int iVar3;
  int iVar4;
  int iVar5;
  Order *this_01;
  OrderRow *pOVar6;
  long lVar7;
  QPainter painter;
  OrderRow row;
  
  QPainter::QPainter(&painter,(QPaintDevice *)&this->field_0x10);
  this_00 = &this->mCellPainter;
  w = CellPainter::cellWidth(this_00);
  h = CellPainter::cellHeight(this_00);
  iVar3 = PatternModel::cursorPattern(this->mModel);
  this_01 = PatternModel::order(this->mModel);
  bVar1 = QWidget::hasFocus();
  iVar5 = this->mPatternStart;
  bVar2 = PatternModel::isPlaying(this->mModel);
  if (bVar2) {
    iVar4 = PatternModel::trackerCursorPattern(this->mModel);
    if ((bVar1 & iVar4 == iVar3) == 0) {
      x = (this->mGridRect).x1;
      QPainter::fillRect(&painter,x,(iVar4 - this->mPatternStart) * h,((this->mGridRect).x2 - x) + 1
                         ,h,&this->mTrackerColor);
    }
  }
  iVar5 = (iVar3 - iVar5) * h;
  if (bVar1 != 0) {
    iVar3 = (this->mGridRect).x1;
    QPainter::fillRect(&painter,iVar3,iVar5,((this->mGridRect).x2 - iVar3) + 1,h,&this->mRowColor);
  }
  if (this->mChangeAll == true) {
    iVar3 = 4;
    iVar4 = 0;
    if (this->mHighNibble == false) {
      iVar4 = w;
    }
    iVar4 = iVar4 + (this->mGridRect).x1 + w;
    while (bVar2 = iVar3 != 0, iVar3 = iVar3 + -1, bVar2) {
      QPainter::fillRect(&painter,iVar4,iVar5,w,h,&this->mCursorColor);
      iVar4 = iVar4 + w * 3;
    }
  }
  else {
    iVar3 = cursorX(this);
    QPainter::fillRect(&painter,iVar3,iVar5,w,h,&this->mCursorColor);
  }
  iVar3 = 0;
  for (iVar5 = this->mPatternStart; iVar5 < this->mPatternEnd; iVar5 = iVar5 + 1) {
    CachedPen::get(&this->mPen,&this->mRownoColor);
    QPainter::setPen((QPen *)&painter);
    CellPainter::drawHex(this_00,&painter,iVar5,4,iVar3);
    CachedPen::get(&this->mPen,&this->mTextColor);
    QPainter::setPen((QPen *)&painter);
    pOVar6 = trackerboy::Order::operator[](this_01,iVar5);
    row._M_elems = *&pOVar6->_M_elems;
    iVar4 = (this->mGridRect).x1;
    for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
      iVar4 = CellPainter::drawHex(this_00,&painter,(uint)row._M_elems[lVar7],iVar4 + w,iVar3);
    }
    iVar3 = iVar3 + h;
  }
  QPainter::fillRect(&painter,(this->mGridRect).x1 + -1,0,1,
                     ((this->mGridRect).y2 - (this->mGridRect).y1) + 1,&this->mLineColor);
  QPainter::~QPainter(&painter);
  return;
}

Assistant:

void OrderGrid::paintEvent(QPaintEvent *evt) {
    Q_UNUSED(evt)

    QPainter painter(this);

    auto const cellWidth = mCellPainter.cellWidth();
    auto const cellHeight = mCellPainter.cellHeight();
    auto const cursorPattern = mModel.cursorPattern();
    auto const& order = mModel.order();
    auto const _hasFocus = hasFocus();

    int cursorYpos = (cursorPattern - mPatternStart) * cellHeight;

    if (mModel.isPlaying()) {
        auto trackerPos = mModel.trackerCursorPattern();
        // draw the tracker position except when the editor has focus and
        // the tracker position is equal to the cursor
        if (trackerPos != cursorPattern || !_hasFocus) {
            painter.fillRect(
                mGridRect.x(),
                (trackerPos - mPatternStart) * cellHeight,
                mGridRect.width(),
                cellHeight,
                mTrackerColor
            );
        }
    }

    // cursor row background
    if (_hasFocus) {
        painter.fillRect(mGridRect.x(), cursorYpos, mGridRect.width(), cellHeight, mRowColor);
    }

    // cursor
    if (mChangeAll) {
        int xpos = mGridRect.x() + cellWidth;
        if (!mHighNibble) {
            xpos += cellWidth;
        }
        int gap = cellWidth * 3;
        for (int i = 0; i < 4; ++i) {
            painter.fillRect(xpos, cursorYpos, cellWidth, cellHeight, mCursorColor);
            xpos += gap;
        }
    
    } else {
        painter.fillRect(cursorX(), cursorYpos, cellWidth, cellHeight, mCursorColor);
    }

    int ypos = 0;
    for (int i = mPatternStart; i < mPatternEnd; ++i) {
        painter.setPen(mPen.get(mRownoColor));
        // rowno
        mCellPainter.drawHex(painter, i, SPACING, ypos);

        // order data
        painter.setPen(mPen.get(mTextColor));
        auto const row = order[i];
        int xpos = mGridRect.x();
        for (auto id : row) {
            xpos += cellWidth;
            xpos = mCellPainter.drawHex(painter, id, xpos, ypos);
        }

        ypos += cellHeight;
    }


    // line
    painter.fillRect(mGridRect.x() - LINE_WIDTH, 0, LINE_WIDTH, mGridRect.height(), mLineColor);
}